

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2streams.cpp
# Opt level: O0

void __thiscall Http2::Stream::Stream(Stream *this,QString *cacheKey,quint32 id,qint32 recvSize)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_RDI;
  QString *in_stack_ffffffffffffffd8;
  
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*,_false>(in_RDI);
  *(undefined4 *)&in_RDI[1].first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = in_EDX;
  *(undefined4 *)((long)&in_RDI[1].first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + 4) =
       0xffff;
  *(undefined4 *)&in_RDI[1].first.d.d.ptr = in_ECX;
  *(undefined4 *)((long)&in_RDI[1].first.d.d.ptr + 4) = 4;
  QString::QString((QString *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

Stream::Stream(const QString &cacheKey, quint32 id, qint32 recvSize)
    : streamID(id),
      // sendWindow is 0, this stream only receives data
      recvWindow(recvSize),
      state(remoteReserved),
      key(cacheKey)
{
}